

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

Value * __thiscall
soul::heart::Variable::getAsConstant(Value *__return_storage_ptr__,Variable *this)

{
  Variable *this_local;
  
  soul::Value::Value(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Value getAsConstant() const override                { return {}; }